

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

int Sdm_ManComputeFunc(Sdm_Man_t *p,int iDsdLit0,int iDsdLit1,int *pCut,int uMask,int fXor)

{
  Sdm_Dsd_t *pSVar1;
  Vec_Wrd_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  word local_c8;
  ulong local_c0;
  ulong local_b8;
  int local_98 [2];
  int pLeavesNew [6];
  word t;
  word t1;
  word t0;
  word Truth1p;
  word Truth0;
  int ComplMask;
  int PermMask;
  int Res;
  int fCompl;
  int iClass;
  int Config;
  int i;
  int fXor_local;
  int uMask_local;
  int *pCut_local;
  int iDsdLit1_local;
  int iDsdLit0_local;
  Sdm_Man_t *p_local;
  
  p->nAllDsd = p->nAllDsd + 1;
  if (uMask < 2) {
    __assert_fail("uMask > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a1,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  if (0x4a5 < iDsdLit0) {
    __assert_fail("iDsdLit0 < DSD_CLASS_NUM * 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a2,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  if (0x4a5 < iDsdLit1) {
    __assert_fail("iDsdLit1 < DSD_CLASS_NUM * 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                  ,0x3a3,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
  }
  pSVar1 = p->pDsd6;
  iVar2 = Abc_Lit2Var(iDsdLit0);
  local_b8 = pSVar1[iVar2].uTruth;
  p_00 = p->vPerm6;
  iVar2 = Abc_Lit2Var(iDsdLit1);
  iVar3 = Vec_IntEntry(p->vMap2Perm,uMask & 0x3ffff);
  t0 = Vec_WrdEntry(p_00,iVar2 * 0x2d0 + iVar3);
  if (uMask >> 0x12 != 0) {
    for (iClass = 0; iClass < 6; iClass = iClass + 1) {
      if (((uMask >> 0x12) >> ((byte)iClass & 0x1f) & 1U) != 0) {
        t0 = Abc_Tt6Flip(t0,iClass);
      }
    }
  }
  iVar2 = Abc_LitIsCompl(iDsdLit0);
  if (iVar2 != 0) {
    local_b8 = local_b8 ^ 0xffffffffffffffff;
  }
  iVar2 = Abc_LitIsCompl(iDsdLit1);
  if (iVar2 == 0) {
    local_c0 = t0;
  }
  else {
    local_c0 = t0 ^ 0xffffffffffffffff;
  }
  if (fXor == 0) {
    local_c8 = local_b8 & local_c0;
  }
  else {
    local_c8 = local_b8 ^ local_c0;
  }
  uVar4 = Sdm_ManCheckDsd6(p,local_c8);
  if (uVar4 == 0xffffffff) {
    p->nNonDsd = p->nNonDsd + 1;
    p_local._4_4_ = -1;
  }
  else {
    iVar2 = (int)uVar4 >> 0x11;
    p_local._4_4_ = Abc_Var2Lit(iVar2,(int)uVar4 >> 0x10 & 1);
    uVar5 = (int)(uVar4 & 0xffff) >> 6;
    if (0x2cf < uVar5) {
      __assert_fail("(Config >> 6) < 720",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                    ,0x3c8,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
    }
    if (pCut != (int *)0x0) {
      pLeavesNew[0] = -1;
      pLeavesNew[1] = -1;
      pLeavesNew[2] = -1;
      pLeavesNew[3] = -1;
      if (6 < *pCut) {
        __assert_fail("pCut[0] <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                      ,0x3cc,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
      }
      for (iClass = 0; iClass < *pCut; iClass = iClass + 1) {
        iVar3 = Abc_LitNotCond(pCut[iClass + 1],(int)(uVar4 & 0xffff) >> ((byte)iClass & 0x1f) & 1);
        pLeavesNew[(long)(int)p->Perm6[(int)uVar5][iClass] + -2] = iVar3;
      }
      *pCut = p->pDsd6[iVar2].nVars;
      for (iClass = 0; iClass < *pCut; iClass = iClass + 1) {
        if (pLeavesNew[(long)iClass + -2] == -1) {
          __assert_fail("pLeavesNew[i] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                        ,0x3d1,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
        }
      }
      for (iClass = 0; iClass < *pCut; iClass = iClass + 1) {
        pCut[iClass + 1] = pLeavesNew[(long)iClass + -2];
      }
    }
    if (0x252 < iVar2) {
      __assert_fail("iClass < DSD_CLASS_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilDsd.c"
                    ,0x3d5,"int Sdm_ManComputeFunc(Sdm_Man_t *, int, int, int *, int, int)");
    }
    p->nCountDsd[iVar2] = p->nCountDsd[iVar2] + 1;
  }
  return p_local._4_4_;
}

Assistant:

int Sdm_ManComputeFunc( Sdm_Man_t * p, int iDsdLit0, int iDsdLit1, int * pCut, int uMask, int fXor )
{
//    int fVerbose = 0;
    int i, Config, iClass, fCompl, Res;
    int PermMask = uMask & 0x3FFFF;
    int ComplMask = uMask >> 18;
    word Truth0, Truth1p, t0, t1, t;
    p->nAllDsd++;

    assert( uMask > 1 );
    assert( iDsdLit0 < DSD_CLASS_NUM * 2 );
    assert( iDsdLit1 < DSD_CLASS_NUM * 2 );
    Truth0  = p->pDsd6[Abc_Lit2Var(iDsdLit0)].uTruth;
    Truth1p = Vec_WrdEntry( p->vPerm6, Abc_Lit2Var(iDsdLit1) * 720 + Vec_IntEntry(p->vMap2Perm, PermMask ) );
    if ( ComplMask )
        for ( i = 0; i < 6; i++ )
            if ( (ComplMask >> i) & 1 )
                Truth1p = Abc_Tt6Flip( Truth1p, i );            
    t0 = Abc_LitIsCompl(iDsdLit0) ? ~Truth0  : Truth0;
    t1 = Abc_LitIsCompl(iDsdLit1) ? ~Truth1p : Truth1p;
    t = fXor ? t0 ^ t1 : t0 & t1;
/*
if ( fVerbose )
{
Sdm_ManPrintPerm( PermMask );                      printf( "\n" );
Extra_PrintBinary( stdout, &ComplMask, 6 );        printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth0, 6 );   printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth1p, 6 );  printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );        printf( "\n" );
}
*/
    // find configuration
    Config = Sdm_ManCheckDsd6( p, t );
    if ( Config == -1 )
    {
        p->nNonDsd++;
        return -1;
    }

    // get the class
    iClass = Config >> 17;
    fCompl = (Config >> 16) & 1;
    Config &= 0xFFFF;

    // set the function
    Res = Abc_Var2Lit( iClass, fCompl );

    // update cut
    assert( (Config >> 6) < 720 );
    if ( pCut )
    {
        int pLeavesNew[6] = { -1, -1, -1, -1, -1, -1 };
        assert( pCut[0] <= 6 );
        for ( i = 0; i < pCut[0]; i++ )
            pLeavesNew[(int)(p->Perm6[Config >> 6][i])] = Abc_LitNotCond( pCut[i+1], (Config >> i) & 1 );
        pCut[0] = p->pDsd6[iClass].nVars;
        for ( i = 0; i < pCut[0]; i++ )
            assert( pLeavesNew[i] != -1 );
        for ( i = 0; i < pCut[0]; i++ )
            pCut[i+1] = pLeavesNew[i];
    }
    assert( iClass < DSD_CLASS_NUM );
    p->nCountDsd[iClass]++;
    return Res;
}